

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

int __thiscall Js::JavascriptBigInt::CompareAbsolute(JavascriptBigInt *this,JavascriptBigInt *pbi)

{
  unsigned_long uVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  unsigned_long **ppuVar5;
  undefined4 *puVar6;
  Type local_28;
  digit_t index;
  JavascriptBigInt *pbi_local;
  JavascriptBigInt *this_local;
  
  if (pbi->m_length < this->m_length) {
    this_local._4_4_ = 1;
  }
  else if (this->m_length < pbi->m_length) {
    this_local._4_4_ = -1;
  }
  else if (this->m_length == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = this->m_length;
    do {
      local_28 = local_28 - 1;
      ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&this->m_digits);
      uVar1 = (*ppuVar5)[local_28];
      ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&pbi->m_digits);
      if (uVar1 != (*ppuVar5)[local_28]) {
        ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&this->m_digits);
        uVar1 = (*ppuVar5)[local_28];
        ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&pbi->m_digits);
        if (uVar1 == (*ppuVar5)[local_28]) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                      ,0x1aa,"(m_digits[index] != pbi->m_digits[index])",
                                      "m_digits[index] != pbi->m_digits[index]");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&this->m_digits);
        uVar2 = (*ppuVar5)[local_28];
        ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&pbi->m_digits);
        if (uVar2 <= (*ppuVar5)[local_28]) {
          return -1;
        }
        return 1;
      }
    } while (local_28 != 0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int JavascriptBigInt::CompareAbsolute(JavascriptBigInt *pbi)
    {
        digit_t index;

        if (m_length > pbi->m_length)
        {
            return 1;
        }
        if (m_length < pbi->m_length)
        {
            return -1;
        }
        if (0 == m_length)
        {
            return 0;
        }

#pragma prefast(suppress:__WARNING_LOOP_ONLY_EXECUTED_ONCE,"noise")
        for (index = m_length - 1; m_digits[index] == pbi->m_digits[index]; index--)
        {
            if (0 == index)
            {
                return 0;
            }
        }
        Assert(m_digits[index] != pbi->m_digits[index]);

        return (m_digits[index] > pbi->m_digits[index]) ? 1 : -1;
    }